

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perplexity.cpp
# Opt level: O1

bool decode_helper(llama_context *ctx,llama_batch *batch,
                  vector<float,_std::allocator<float>_> *batch_logits,int n_batch,int n_vocab)

{
  int8_t *piVar1;
  pointer pfVar2;
  uint uVar3;
  common_log *log;
  void *__src;
  int iVar4;
  uint uVar5;
  undefined8 in_R9;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int8_t *piVar9;
  bool local_9d;
  undefined4 uStack_60;
  undefined4 local_58;
  undefined4 uStack_50;
  undefined4 local_48;
  undefined4 uStack_40;
  
  uVar7 = batch->n_tokens;
  uVar8 = (ulong)uVar7;
  local_9d = (int)uVar7 < 1;
  if (0 < (int)uVar7) {
    lVar6 = 0;
    iVar4 = 0;
    do {
      uVar7 = (int)uVar8 - (int)lVar6;
      if (n_batch <= (int)uVar7) {
        uVar7 = n_batch;
      }
      piVar1 = batch->logits;
      uStack_60 = SUB84(batch->token + lVar6,0);
      local_58 = 0;
      uStack_50 = SUB84(batch->pos + lVar6,0);
      local_48 = SUB84(batch->n_seq_id + lVar6,0);
      uStack_40 = SUB84(batch->seq_id + lVar6,0);
      uVar5 = uVar7;
      piVar9 = piVar1 + lVar6;
      uVar3 = llama_decode(ctx);
      if (uVar3 == 0) {
        if ((int)uVar7 < 1) {
          uVar5 = 0;
        }
        else {
          uVar8 = 0;
          uVar5 = 0;
          do {
            uVar5 = (uVar5 + 1) - (uint)((piVar1 + lVar6)[uVar8] == '\0');
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar7);
        }
        pfVar2 = (batch_logits->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __src = (void *)llama_get_logits(ctx);
        memcpy(pfVar2 + (long)iVar4 * (long)n_vocab,__src,(ulong)uVar5 * (long)n_vocab * 4);
        iVar4 = iVar4 + uVar5;
      }
      else if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_ERROR,
                       "failed to decode the batch, n_batch = %d, ret = %d\n",(ulong)(uint)n_batch,
                       (ulong)uVar3,in_R9,uVar5,uStack_60,local_58,uStack_50,local_48,uStack_40,
                       piVar9);
      }
      if (uVar3 != 0) {
        return local_9d;
      }
      lVar6 = lVar6 + n_batch;
      uVar8 = (ulong)batch->n_tokens;
      local_9d = (long)uVar8 <= lVar6;
    } while (lVar6 < (long)uVar8);
  }
  return local_9d;
}

Assistant:

static bool decode_helper(llama_context * ctx, llama_batch & batch, std::vector<float> & batch_logits, int n_batch, int n_vocab) {
    int prev_outputs = 0;
    for (int i = 0; i < (int) batch.n_tokens; i += n_batch) {
        const int n_tokens = std::min<int>(n_batch, batch.n_tokens - i);

        llama_batch batch_view = {
            n_tokens,
            batch.token    + i,
            nullptr,
            batch.pos      + i,
            batch.n_seq_id + i,
            batch.seq_id   + i,
            batch.logits   + i,
        };

        const int ret = llama_decode(ctx, batch_view);
        if (ret != 0) {
            LOG_ERR("failed to decode the batch, n_batch = %d, ret = %d\n", n_batch, ret);
            return false;
        }

        int n_outputs = 0;
        for (int i = 0; i < n_tokens; ++i) {
            n_outputs += batch_view.logits[i] != 0;
        }

        memcpy(batch_logits.data() + size_t(prev_outputs)*n_vocab, llama_get_logits(ctx), size_t(n_outputs)*n_vocab*sizeof(float));

        prev_outputs += n_outputs;
    }

    return true;
}